

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O3

RuntimeArray * __thiscall
spvtools::opt::InstrumentPass::GetUintXRuntimeArrayType
          (InstrumentPass *this,uint32_t width,RuntimeArray **rarr_ty)

{
  IRContext *pIVar1;
  uint32_t id;
  uint32_t uVar2;
  Integer *element;
  RuntimeArray *pRVar3;
  
  pRVar3 = *rarr_ty;
  if (pRVar3 == (RuntimeArray *)0x0) {
    element = GetInteger(this,width,false);
    pRVar3 = GetRuntimeArray(this,&element->super_Type);
    *rarr_ty = pRVar3;
    pIVar1 = (this->super_Pass).context_;
    if ((pIVar1->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
      IRContext::BuildTypeManager(pIVar1);
      pRVar3 = *rarr_ty;
    }
    id = analysis::TypeManager::GetTypeInstruction
                   ((pIVar1->type_mgr_)._M_t.
                    super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                    .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>.
                    _M_head_impl,&pRVar3->super_Type);
    pIVar1 = (this->super_Pass).context_;
    if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(pIVar1);
    }
    uVar2 = analysis::DefUseManager::NumUses
                      ((pIVar1->def_use_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                       _M_head_impl,id);
    if (uVar2 != 0) {
      __assert_fail("get_def_use_mgr()->NumUses(uint_arr_ty_id) == 0 && \"used RuntimeArray type returned\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instrument_pass.cpp"
                    ,0x1b9,
                    "analysis::RuntimeArray *spvtools::opt::InstrumentPass::GetUintXRuntimeArrayType(uint32_t, analysis::RuntimeArray **)"
                   );
    }
    pIVar1 = (this->super_Pass).context_;
    if ((pIVar1->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
      IRContext::BuildDecorationManager(pIVar1);
    }
    analysis::DecorationManager::AddDecorationVal
              ((pIVar1->decoration_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>.
               _M_head_impl,id,6,width >> 3);
    pRVar3 = *rarr_ty;
  }
  return pRVar3;
}

Assistant:

analysis::RuntimeArray* InstrumentPass::GetUintXRuntimeArrayType(
    uint32_t width, analysis::RuntimeArray** rarr_ty) {
  if (*rarr_ty == nullptr) {
    *rarr_ty = GetRuntimeArray(GetInteger(width, false));
    uint32_t uint_arr_ty_id =
        context()->get_type_mgr()->GetTypeInstruction(*rarr_ty);
    // By the Vulkan spec, a pre-existing RuntimeArray of uint must be part of
    // a block, and will therefore be decorated with an ArrayStride. Therefore
    // the undecorated type returned here will not be pre-existing and can
    // safely be decorated. Since this type is now decorated, it is out of
    // sync with the TypeManager and therefore the TypeManager must be
    // invalidated after this pass.
    assert(get_def_use_mgr()->NumUses(uint_arr_ty_id) == 0 &&
           "used RuntimeArray type returned");
    get_decoration_mgr()->AddDecorationVal(
        uint_arr_ty_id, uint32_t(spv::Decoration::ArrayStride), width / 8u);
  }
  return *rarr_ty;
}